

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast.h
# Opt level: O0

handle pybind11::detail::type_caster_generic::cast
                 (void *_src,return_value_policy policy,handle parent,type_info *type_info,
                 type_info *type_info_backup,_func_void_ptr_void_ptr *copy_constructor,
                 _func_void_ptr_void_ptr *move_constructor,void *existing_holder)

{
  code *pcVar1;
  undefined8 uVar2;
  iterator this;
  bool bVar3;
  handle *phVar4;
  _Node_iterator_base<std::pair<const_std::type_index,_void_*>,_false> this_00;
  char *__s;
  pointer ppVar5;
  pointer ppVar6;
  _Node_iterator_base<std::pair<const_void_*const,_void_*>,_false> _Var7;
  PyObject *pPVar8;
  PyObject **ppPVar9;
  void *pvVar10;
  Py_ssize_t PVar11;
  cast_error *pcVar12;
  unordered_multimap<void_const*,void*,std::hash<void_const*>,std::equal_to<void_const*>,std::allocator<std::pair<void_const*const,void*>>>
  *this_01;
  instance<void,_std::unique_ptr<void,_std::default_delete<void>_>_> *wrapper;
  handle local_118;
  object inst;
  type_info *instance_type;
  _Node_iterator<std::pair<const_void_*const,_void_*>,_false,_false> it_i;
  pair<std::__detail::_Node_iterator<std::pair<const_void_*const,_void_*>,_false,_false>,_std::__detail::_Node_iterator<std::pair<const_void_*const,_void_*>,_false,_false>_>
  it_instances;
  type_info *tinfo;
  string msg;
  undefined1 local_b8 [8];
  string tname;
  type_index local_90;
  _Node_iterator_base<std::pair<const_std::type_index,_void_*>,_false> local_88;
  _Node_iterator_base<std::pair<const_std::type_index,_void_*>,_false> local_80;
  type_index local_78;
  _Node_iterator_base<std::pair<const_std::type_index,_void_*>,_false> local_70;
  iterator it;
  internals *internals;
  handle local_50;
  void *local_48;
  void *src;
  _func_void_ptr_void_ptr *copy_constructor_local;
  type_info *type_info_backup_local;
  type_info *type_info_local;
  void *pvStack_20;
  return_value_policy policy_local;
  void *_src_local;
  handle parent_local;
  
  local_48 = _src;
  src = copy_constructor;
  copy_constructor_local = (_func_void_ptr_void_ptr *)type_info_backup;
  type_info_backup_local = type_info;
  type_info_local._7_1_ = policy;
  pvStack_20 = _src;
  _src_local = parent.m_ptr;
  if (_src == (void *)0x0) {
    none::none((none *)&local_50);
    phVar4 = handle::inc_ref(&local_50);
    parent_local.m_ptr = phVar4->m_ptr;
    none::~none((none *)&local_50);
  }
  else {
    this_00._M_cur = (__node_type *)get_internals();
    it.super__Node_iterator_base<std::pair<const_std::type_index,_void_*>,_false>._M_cur =
         (_Node_iterator_base<std::pair<const_std::type_index,_void_*>,_false>)
         (_Node_iterator_base<std::pair<const_std::type_index,_void_*>,_false>)this_00._M_cur;
    std::type_index::type_index(&local_78,type_info_backup_local);
    local_70._M_cur =
         (__node_type *)
         std::
         unordered_map<std::type_index,_void_*,_std::hash<std::type_index>,_std::equal_to<std::type_index>,_std::allocator<std::pair<const_std::type_index,_void_*>_>_>
         ::find((unordered_map<std::type_index,_void_*,_std::hash<std::type_index>,_std::equal_to<std::type_index>,_std::allocator<std::pair<const_std::type_index,_void_*>_>_>
                 *)this_00._M_cur,&local_78);
    local_80._M_cur =
         (__node_type *)
         std::
         unordered_map<std::type_index,_void_*,_std::hash<std::type_index>,_std::equal_to<std::type_index>,_std::allocator<std::pair<const_std::type_index,_void_*>_>_>
         ::end(it.super__Node_iterator_base<std::pair<const_std::type_index,_void_*>,_false>._M_cur)
    ;
    bVar3 = std::__detail::operator==(&local_70,&local_80);
    this = it;
    if (bVar3) {
      type_info_backup_local = (type_info *)copy_constructor_local;
      std::type_index::type_index(&local_90,(type_info *)copy_constructor_local);
      local_88._M_cur =
           (__node_type *)
           std::
           unordered_map<std::type_index,_void_*,_std::hash<std::type_index>,_std::equal_to<std::type_index>,_std::allocator<std::pair<const_std::type_index,_void_*>_>_>
           ::find(this.super__Node_iterator_base<std::pair<const_std::type_index,_void_*>,_false>.
                  _M_cur,&local_90);
      local_70._M_cur = local_88._M_cur;
    }
    tname.field_2._8_8_ =
         std::
         unordered_map<std::type_index,_void_*,_std::hash<std::type_index>,_std::equal_to<std::type_index>,_std::allocator<std::pair<const_std::type_index,_void_*>_>_>
         ::end((unordered_map<std::type_index,_void_*,_std::hash<std::type_index>,_std::equal_to<std::type_index>,_std::allocator<std::pair<const_std::type_index,_void_*>_>_>
                *)it.super__Node_iterator_base<std::pair<const_std::type_index,_void_*>,_false>.
                  _M_cur);
    bVar3 = std::__detail::operator==
                      (&local_70,
                       (_Node_iterator_base<std::pair<const_std::type_index,_void_*>,_false> *)
                       ((long)&tname.field_2 + 8));
    if (bVar3) {
      __s = std::type_info::name(type_info_backup_local);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_b8,__s,(allocator<char> *)(msg.field_2._M_local_buf + 0xf));
      std::allocator<char>::~allocator((allocator<char> *)(msg.field_2._M_local_buf + 0xf));
      clean_type_id((string *)local_b8);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&tinfo,
                     "Unregistered type : ",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b8);
      uVar2 = _PyExc_TypeError;
      std::__cxx11::string::c_str();
      PyErr_SetString(uVar2);
      memset(&parent_local,0,8);
      handle::handle(&parent_local);
      std::__cxx11::string::~string((string *)&tinfo);
      std::__cxx11::string::~string((string *)local_b8);
    }
    else {
      ppVar5 = std::__detail::_Node_iterator<std::pair<const_std::type_index,_void_*>,_false,_false>
               ::operator->((_Node_iterator<std::pair<const_std::type_index,_void_*>,_false,_false>
                             *)&local_70);
      it_instances.second.super__Node_iterator_base<std::pair<const_void_*const,_void_*>,_false>.
      _M_cur = (_Node_iterator_base<std::pair<const_void_*const,_void_*>,_false>)ppVar5->second;
      _it_i = std::
              unordered_multimap<const_void_*,_void_*,_std::hash<const_void_*>,_std::equal_to<const_void_*>,_std::allocator<std::pair<const_void_*const,_void_*>_>_>
              ::equal_range((unordered_multimap<const_void_*,_void_*,_std::hash<const_void_*>,_std::equal_to<const_void_*>,_std::allocator<std::pair<const_void_*const,_void_*>_>_>
                             *)((long)it.
                                      super__Node_iterator_base<std::pair<const_std::type_index,_void_*>,_false>
                                      ._M_cur + 0x70),&local_48);
      instance_type =
           (type_info *)
           it_i.super__Node_iterator_base<std::pair<const_void_*const,_void_*>,_false>._M_cur;
      while (bVar3 = std::__detail::operator!=
                               ((_Node_iterator_base<std::pair<const_void_*const,_void_*>,_false> *)
                                &instance_type,
                                (_Node_iterator_base<std::pair<const_void_*const,_void_*>,_false> *)
                                &it_instances), bVar3) {
        ppVar6 = std::__detail::_Node_iterator<std::pair<const_void_*const,_void_*>,_false,_false>::
                 operator->((_Node_iterator<std::pair<const_void_*const,_void_*>,_false,_false> *)
                            &instance_type);
        _Var7._M_cur = (__node_type *)get_type_info(*(PyTypeObject **)((long)ppVar6->second + 8));
        if (((type_info *)_Var7._M_cur != (type_info *)0x0) &&
           ((_Node_iterator_base<std::pair<const_void_*const,_void_*>,_false>)_Var7._M_cur ==
            it_instances.second.
            super__Node_iterator_base<std::pair<const_void_*const,_void_*>,_false>._M_cur)) {
          ppVar6 = std::__detail::_Node_iterator<std::pair<const_void_*const,_void_*>,_false,_false>
                   ::operator->((_Node_iterator<std::pair<const_void_*const,_void_*>,_false,_false>
                                 *)&instance_type);
          handle::handle(&inst.super_handle,(PyObject *)ppVar6->second);
          phVar4 = handle::inc_ref(&inst.super_handle);
          return (handle)phVar4->m_ptr;
        }
        std::__detail::_Node_iterator<std::pair<const_void_*const,_void_*>,_false,_false>::
        operator++((_Node_iterator<std::pair<const_void_*const,_void_*>,_false,_false> *)
                   &instance_type);
      }
      pPVar8 = (PyObject *)
               PyType_GenericAlloc(*(undefined8 *)
                                    it_instances.second.
                                    super__Node_iterator_base<std::pair<const_void_*const,_void_*>,_false>
                                    ._M_cur,0);
      handle::handle((handle *)&wrapper,pPVar8);
      reinterpret_steal<pybind11::object>((pybind11 *)&local_118,(handle)wrapper);
      ppPVar9 = handle::ptr(&local_118);
      pPVar8 = *ppPVar9;
      pPVar8[1].ob_refcnt = 0;
      *(byte *)&pPVar8[2].ob_refcnt = (byte)pPVar8[2].ob_refcnt & 0xfe;
      switch(type_info_local._7_1_) {
      case automatic:
      case take_ownership:
        pPVar8[1].ob_refcnt = (Py_ssize_t)local_48;
        *(byte *)&pPVar8[2].ob_refcnt = (byte)pPVar8[2].ob_refcnt & 0xfe | 1;
        break;
      case automatic_reference:
      case reference:
        pPVar8[1].ob_refcnt = (Py_ssize_t)local_48;
        *(byte *)&pPVar8[2].ob_refcnt = (byte)pPVar8[2].ob_refcnt & 0xfe;
        break;
      case copy:
        if (src == (void *)0x0) {
          pcVar12 = (cast_error *)__cxa_allocate_exception(0x10);
          cast_error::runtime_error
                    (pcVar12,"return_value_policy = copy, but the object is non-copyable!");
          __cxa_throw(pcVar12,&cast_error::typeinfo,cast_error::~cast_error);
        }
        PVar11 = (*(code *)src)(local_48);
        pPVar8[1].ob_refcnt = PVar11;
        *(byte *)&pPVar8[2].ob_refcnt = (byte)pPVar8[2].ob_refcnt & 0xfe | 1;
        break;
      case move:
        if (move_constructor == (_func_void_ptr_void_ptr *)0x0) {
          if (src == (void *)0x0) {
            pcVar12 = (cast_error *)__cxa_allocate_exception(0x10);
            cast_error::runtime_error
                      (pcVar12,
                       "return_value_policy = move, but the object is neither movable nor copyable!"
                      );
            __cxa_throw(pcVar12,&cast_error::typeinfo,cast_error::~cast_error);
          }
          PVar11 = (*(code *)src)(local_48);
          pPVar8[1].ob_refcnt = PVar11;
        }
        else {
          pvVar10 = (*move_constructor)(local_48);
          pPVar8[1].ob_refcnt = (Py_ssize_t)pvVar10;
        }
        *(byte *)&pPVar8[2].ob_refcnt = (byte)pPVar8[2].ob_refcnt & 0xfe | 1;
        break;
      case reference_internal:
        pPVar8[1].ob_refcnt = (Py_ssize_t)local_48;
        *(byte *)&pPVar8[2].ob_refcnt = (byte)pPVar8[2].ob_refcnt & 0xfe;
        keep_alive_impl(local_118,(handle)_src_local);
        break;
      default:
        pcVar12 = (cast_error *)__cxa_allocate_exception(0x10);
        cast_error::runtime_error(pcVar12,"unhandled return_value_policy: should not happen!");
        __cxa_throw(pcVar12,&cast_error::typeinfo,cast_error::~cast_error);
      }
      pcVar1 = *(code **)((long)it_instances.second.
                                super__Node_iterator_base<std::pair<const_void_*const,_void_*>,_false>
                                ._M_cur + 0x10);
      ppPVar9 = handle::ptr(&local_118);
      (*pcVar1)(*ppPVar9,existing_holder);
      this_01 = (unordered_multimap<void_const*,void*,std::hash<void_const*>,std::equal_to<void_const*>,std::allocator<std::pair<void_const*const,void*>>>
                 *)((long)it.
                          super__Node_iterator_base<std::pair<const_std::type_index,_void_*>,_false>
                          ._M_cur + 0x70);
      ppPVar9 = handle::ptr(&local_118);
      std::
      unordered_multimap<void_const*,void*,std::hash<void_const*>,std::equal_to<void_const*>,std::allocator<std::pair<void_const*const,void*>>>
      ::emplace<void*&,_object*&>(this_01,(void **)(pPVar8 + 1),ppPVar9);
      parent_local = object::release((object *)&local_118);
      object::~object((object *)&local_118);
    }
  }
  return (handle)parent_local.m_ptr;
}

Assistant:

PYBIND11_NOINLINE static handle cast(const void *_src, return_value_policy policy, handle parent,
                                         const std::type_info *type_info,
                                         const std::type_info *type_info_backup,
                                         void *(*copy_constructor)(const void *),
                                         void *(*move_constructor)(const void *),
                                         const void *existing_holder = nullptr) {
        void *src = const_cast<void *>(_src);
        if (src == nullptr)
            return none().inc_ref();

        auto &internals = get_internals();

        auto it = internals.registered_types_cpp.find(std::type_index(*type_info));
        if (it == internals.registered_types_cpp.end()) {
            type_info = type_info_backup;
            it = internals.registered_types_cpp.find(std::type_index(*type_info));
        }

        if (it == internals.registered_types_cpp.end()) {
            std::string tname = type_info->name();
            detail::clean_type_id(tname);
            std::string msg = "Unregistered type : " + tname;
            PyErr_SetString(PyExc_TypeError, msg.c_str());
            return handle();
        }

        auto tinfo = (const detail::type_info *) it->second;

        auto it_instances = internals.registered_instances.equal_range(src);
        for (auto it_i = it_instances.first; it_i != it_instances.second; ++it_i) {
            auto instance_type = detail::get_type_info(Py_TYPE(it_i->second));
            if (instance_type && instance_type == tinfo)
                return handle((PyObject *) it_i->second).inc_ref();
        }

        auto inst = reinterpret_steal<object>(PyType_GenericAlloc(tinfo->type, 0));

        auto wrapper = (instance<void> *) inst.ptr();

        wrapper->value = nullptr;
        wrapper->owned = false;

        switch (policy) {
            case return_value_policy::automatic:
            case return_value_policy::take_ownership:
                wrapper->value = src;
                wrapper->owned = true;
                break;

            case return_value_policy::automatic_reference:
            case return_value_policy::reference:
                wrapper->value = src;
                wrapper->owned = false;
                break;

            case return_value_policy::copy:
                if (copy_constructor)
                    wrapper->value = copy_constructor(src);
                else
                    throw cast_error("return_value_policy = copy, but the "
                                     "object is non-copyable!");
                wrapper->owned = true;
                break;

            case return_value_policy::move:
                if (move_constructor)
                    wrapper->value = move_constructor(src);
                else if (copy_constructor)
                    wrapper->value = copy_constructor(src);
                else
                    throw cast_error("return_value_policy = move, but the "
                                     "object is neither movable nor copyable!");
                wrapper->owned = true;
                break;

            case return_value_policy::reference_internal:
                wrapper->value = src;
                wrapper->owned = false;
                detail::keep_alive_impl(inst, parent);
                break;

            default:
                throw cast_error("unhandled return_value_policy: should not happen!");
        }

        tinfo->init_holder(inst.ptr(), existing_holder);

        internals.registered_instances.emplace(wrapper->value, inst.ptr());

        return inst.release();
    }